

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
ValidatorTest_ReturnUnreachable_Test::TestBody(ValidatorTest_ReturnUnreachable_Test *this)

{
  byte bVar1;
  bool bVar2;
  Expression *pEVar3;
  Module *pMVar4;
  char *message;
  Name name;
  string local_4d8;
  AssertHelper local_4b8;
  Message local_4b0;
  undefined1 local_4a2;
  bool local_4a1;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_;
  undefined1 auStack_488 [4];
  int flags;
  Type TStack_480;
  pointer local_478;
  Type local_470;
  Type local_468;
  Signature local_460;
  HeapType local_450;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> local_448;
  Name local_430;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_420;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Builder local_408;
  Builder builder;
  Module module;
  ValidatorTest_ReturnUnreachable_Test *this_local;
  
  ::wasm::Module::Module((Module *)&builder);
  ::wasm::Builder::Builder(&local_408,(Module *)&builder);
  ::wasm::Name::Name(&local_430,"func");
  local_448.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::vector(&local_448);
  ::wasm::Type::Type(&local_468,none);
  ::wasm::Type::Type(&local_470,none);
  ::wasm::Signature::Signature(&local_460,local_468,local_470);
  ::wasm::HeapType::HeapType(&local_450,local_460);
  _auStack_488 = (pointer)0x0;
  TStack_480.id = 0;
  local_478 = (pointer)0x0;
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::vector
            ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)auStack_488);
  pEVar3 = (Expression *)::wasm::Builder::makeUnreachable(&local_408);
  ::wasm::Builder::makeReturn(&local_408,pEVar3);
  pEVar3 = (Expression *)auStack_488;
  name.super_IString.str._M_str = (char *)local_430.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&local_420;
  ::wasm::Builder::makeFunction
            (name,(vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)
                  local_430.super_IString.str._M_str,(HeapType)&local_448,
             (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_450.id,pEVar3);
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector
            ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)auStack_488);
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector(&local_448);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 6;
  pMVar4 = (Module *)
           std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(&local_420);
  bVar1 = ::wasm::WasmValidator::validate((Function *)&local_4a2,pMVar4,(uint)&builder);
  local_4a1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a0,&local_4a1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar2) {
    testing::Message::Message(&local_4b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4d8,(internal *)local_4a0,
               (AssertionResult *)"WasmValidator{}.validate(func.get(), module, flags)","true",
               "false",(char *)pEVar3);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/validator.cpp"
               ,0x42,message);
    testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    std::__cxx11::string::~string((string *)&local_4d8);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_420);
  ::wasm::Module::~Module((Module *)&builder);
  return;
}

Assistant:

TEST(ValidatorTest, ReturnUnreachable) {
  Module module;
  Builder builder(module);

  // (return (unreachable)) should be invalid if a function has no return type.
  auto func =
    builder.makeFunction("func",
                         {},
                         Signature(Type::none, Type::none),
                         {},
                         builder.makeReturn(builder.makeUnreachable()));

  auto flags =
    WasmValidator::FlagValues::Globally | WasmValidator::FlagValues::Quiet;
  EXPECT_FALSE(WasmValidator{}.validate(func.get(), module, flags));
}